

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRule::DebugXml(GdlRule *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur,
                 int nPassNum,int nRuleNum)

{
  pointer pcVar1;
  GdlExpression *pGVar2;
  GdlRuleItem *pGVar3;
  bool bVar4;
  ostream *poVar5;
  pointer ppGVar6;
  long lVar7;
  pointer ppGVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  bool bVar12;
  GrpLineAndFile lnf;
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8;
  string local_d8;
  pointer local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"      <rule id=\"",0x10);
  poVar5 = (ostream *)std::ostream::operator<<(strmOut,nPassNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,nRuleNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" inFile=\"",10);
  pcVar1 = (staPathToCur->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + staPathToCur->_M_string_length);
  GrpLineAndFile::FileWithPath((string *)local_120,(GrpLineAndFile *)this,&local_50);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)CONCAT44(local_120._4_4_,local_120._0_4_),local_120._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" atLine=\"",10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->super_GdlObject).m_lnf.m_nLineOrig);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" preAnys=\"",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n            prettyPrint=\"",0x1b);
  if ((undefined1 *)CONCAT44(local_120._4_4_,local_120._0_4_) != local_120 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_120._4_4_,local_120._0_4_),local_120._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  RulePrettyPrint(this,pcman,(ostream *)strmOut,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" >\n",4);
  if ((this->m_vpexpConstraints).
      super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vpexpConstraints).
      super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"        <ruleConstraints>\n",0x1a);
    ppGVar6 = (this->m_vpexpConstraints).
              super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_vpexpConstraints).
        super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppGVar6) {
      uVar9 = 0;
      do {
        GrpLineAndFile::GrpLineAndFile
                  ((GrpLineAndFile *)local_120,&(ppGVar6[uVar9]->super_GdlObject).m_lnf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)strmOut,"          <ruleConstraint gdl=\"{ ",0x21);
        pGVar2 = (this->m_vpexpConstraints).
                 super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        (*pGVar2->_vptr_GdlExpression[0x1d])(pGVar2,pcman,strmOut,1,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut," }\" inFile=\"",0xc);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        pcVar1 = (staPathToCur->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar1,pcVar1 + staPathToCur->_M_string_length);
        GrpLineAndFile::FileWithPath(&local_d8,(GrpLineAndFile *)local_120,&local_f8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)strmOut,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" atLine=\"",10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_120._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" />\n",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._8_8_ != &local_108) {
          operator_delete((void *)local_120._8_8_,local_108._0_8_ + 1);
        }
        uVar9 = uVar9 + 1;
        ppGVar6 = (this->m_vpexpConstraints).
                  super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(this->m_vpexpConstraints).
                                     super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar6 >> 3
                              ));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"        </ruleConstraints>\n",0x1b);
  }
  bVar12 = this->m_nScanAdvance != -1;
  local_b8 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (uint)((ulong)((long)(this->m_vprit).
                                super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)local_b8) >> 3);
  if ((int)uVar11 < 1) {
    bVar10 = false;
  }
  else {
    uVar9 = 0;
    bVar10 = false;
    bVar4 = this->m_nScanAdvance != -1;
    do {
      pGVar3 = local_b8[uVar9];
      if ((pGVar3 != (GdlRuleItem *)0x0) &&
         (lVar7 = __dynamic_cast(pGVar3,&GdlRuleItem::typeinfo,&GdlSubstitutionItem::typeinfo,0),
         lVar7 != 0)) {
        bVar10 = true;
      }
      bVar12 = true;
      if (((pGVar3 != (GdlRuleItem *)0x0) &&
          (lVar7 = __dynamic_cast(pGVar3,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo,0),
          lVar7 != 0)) && (bVar12 = bVar4, pGVar3->m_pexpConstraint != (GdlExpression *)0x0)) {
        bVar12 = true;
      }
      uVar9 = uVar9 + 1;
      bVar4 = bVar12;
    } while ((uVar11 & 0x7fffffff) != uVar9);
  }
  if (bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"        <lhs>\n",0xe);
    ppGVar8 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppGVar8) {
      uVar9 = 0;
      do {
        pGVar3 = ppGVar8[uVar9];
        pcVar1 = (staPathToCur->_M_dataplus)._M_p;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + staPathToCur->_M_string_length);
        (*pGVar3->_vptr_GdlRuleItem[0x22])(pGVar3,pcman,strmOut,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        uVar9 = uVar9 + 1;
        ppGVar8 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(this->m_vprit).
                                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar8 >> 3
                              ));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"        </lhs>\n",0xf);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"        <rhs>\n",0xe);
  ppGVar8 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar8) {
    uVar9 = 0;
    do {
      pGVar3 = ppGVar8[uVar9];
      pcVar1 = (staPathToCur->_M_dataplus)._M_p;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar1,pcVar1 + staPathToCur->_M_string_length);
      (*pGVar3->_vptr_GdlRuleItem[0x23])(pGVar3,pcman,strmOut,(string *)local_90);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      uVar9 = uVar9 + 1;
      ppGVar8 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->m_vprit).
                                   super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar8 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"        </rhs>\n",0xf);
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"        <context>\n",0x12);
    local_120._0_4_ = 0;
    if ((this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        if ((int)uVar9 == this->m_nScanAdvance) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)strmOut,"          <caret />\n",0x14);
        }
        pGVar3 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar9];
        pcVar1 = (staPathToCur->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + staPathToCur->_M_string_length);
        (*pGVar3->_vptr_GdlRuleItem[0x24])(pGVar3,pcman,strmOut,(string *)local_b0,local_120);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)(this->m_vprit).
                                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_vprit).
                                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"        </context>\n",0x13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"      </rule>\n",0xe);
  return;
}

Assistant:

void GdlRule::DebugXml(GrcManager * pcman, std::ofstream & strmOut, std::string staPathToCur,
	int nPassNum, int nRuleNum)
{
	strmOut << "      <rule id=\"" << nPassNum << "." << nRuleNum
		<< "\" inFile=\"" << LineAndFile().FileWithPath(staPathToCur)
		<< "\" atLine=\"" << LineAndFile().OriginalLine()
		<< "\" preAnys=\"" << m_critPrependedAnys
		<< "\"\n            prettyPrint=\"";
	this->RulePrettyPrint(pcman, strmOut, true);
	strmOut << "\" >\n";

	if (m_vpexpConstraints.size() > 0)
	{
		strmOut << "        <ruleConstraints>\n";
		for (size_t iexp = 0; iexp < m_vpexpConstraints.size(); iexp++)
		{
			GrpLineAndFile lnf = m_vpexpConstraints[iexp]->LineAndFile();
			strmOut << "          <ruleConstraint gdl=\"{ ";
			m_vpexpConstraints[iexp]->PrettyPrint(pcman, strmOut, true);
			strmOut << " }\" inFile=\"" << lnf.FileWithPath(staPathToCur)
				<< "\" atLine=\"" << lnf.OriginalLine() << "\" />\n";
		}
		strmOut << "        </ruleConstraints>\n";
	}

	//	Loop through all the items to see if we need a LHS or a context.
	bool fLhs = false;
	bool fContext = (m_nScanAdvance != -1);
	int irit;
	for (irit = 0; irit < signed(m_vprit.size()) ; irit++)
	{
		GdlRuleItem * prit = m_vprit[irit];
		GdlSubstitutionItem * pritsub = dynamic_cast<GdlSubstitutionItem *>(prit);
		if (pritsub)
			fLhs = true;

		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem *>(prit);
		if (!pritset)
			fContext = true;
		else if (prit->m_pexpConstraint)
			fContext = true;
	}

	// LHS
	if (fLhs)
	{
		strmOut << "        <lhs>\n";
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			m_vprit[irit]->DebugXmlLhs(pcman, strmOut, staPathToCur);
		}
		strmOut << "        </lhs>\n";
	}

	// RHS
	strmOut << "        <rhs>\n";
	for (size_t irit = 0; irit < m_vprit.size(); irit++)
	{
		m_vprit[irit]->DebugXmlRhs(pcman, strmOut, staPathToCur);
	}
	strmOut << "        </rhs>\n";

	// Context
	if (fContext)
	{
		strmOut << "        <context>\n";
		int iritRhs = 0;
		for (size_t irit = 0; irit < m_vprit.size(); irit++)
		{
			if (m_nScanAdvance == (signed)irit)
				strmOut << "          <caret />\n";

			m_vprit[irit]->DebugXmlContext(pcman, strmOut, staPathToCur, iritRhs);
		}
		strmOut << "        </context>\n";
	}

	strmOut << "      </rule>\n";
}